

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::findBucketWithHash<QString>
          (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *this,QString *key,size_t hash)

{
  ulong uVar1;
  Span *pSVar2;
  char16_t *pcVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  char cVar7;
  ulong uVar8;
  Span *pSVar9;
  Span *pSVar10;
  ulong uVar11;
  QStringView QVar12;
  Bucket BVar13;
  QStringView QVar14;
  
  uVar1 = *(ulong *)(this + 0x10);
  pSVar2 = *(Span **)(this + 0x20);
  uVar11 = uVar1 - 1 & hash;
  pSVar9 = pSVar2 + (uVar11 >> 7);
  uVar11 = (ulong)((uint)uVar11 & 0x7f);
  pcVar3 = (key->d).ptr;
  lVar4 = (key->d).size;
  do {
    if (pSVar9->offsets[uVar11] == 0xff) {
LAB_00494982:
      bVar6 = false;
    }
    else {
      uVar8 = (ulong)((uint)pSVar9->offsets[uVar11] * 0x30);
      lVar5 = *(long *)(pSVar9->entries[1].storage.data + uVar8);
      if (lVar5 == lVar4) {
        QVar12.m_data = *(storage_type_conflict **)((pSVar9->entries->storage).data + uVar8 + 8);
        QVar12.m_size = lVar5;
        QVar14.m_data = pcVar3;
        QVar14.m_size = lVar4;
        cVar7 = QtPrivate::equalStrings(QVar12,QVar14);
        if (cVar7 != '\0') goto LAB_00494982;
      }
      uVar11 = uVar11 + 1;
      bVar6 = true;
      if (uVar11 == 0x80) {
        pSVar10 = pSVar9 + 1;
        pSVar9 = pSVar2;
        if (((long)pSVar10 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (uVar1 >> 7) != 0) {
          pSVar9 = pSVar10;
        }
        uVar11 = 0;
      }
    }
    if (!bVar6) {
      BVar13.index = uVar11;
      BVar13.span = pSVar9;
      return BVar13;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }